

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapAllocator.cpp
# Opt level: O2

HeapAllocator * Memory::HeapAllocator::GetNoMemProtectInstance(void)

{
  return &Instance;
}

Assistant:

HeapAllocator * HeapAllocator::GetNoMemProtectInstance()
{
#ifdef INTERNAL_MEM_PROTECT_HEAP_ALLOC
    // Used only in Chakra, no need to use CUSTOM_CONFIG_FLAG
    if (CONFIG_FLAG(MemProtectHeap))
    {
        return &NoMemProtectInstance;
    }
#endif
    return &Instance;
}